

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

exr_result_t exr_start_read(exr_context_t *ctxt,char *filename,exr_context_initializer_t *ctxtdata)

{
  _internal_exr_context *p_Var1;
  exr_result_t eVar2;
  exr_result_t eVar3;
  int64_t iVar4;
  _internal_exr_context *ret;
  exr_context_initializer_t inits;
  _internal_exr_context *local_90;
  exr_context_initializer_t local_88;
  
  local_90 = (_internal_exr_context *)0x0;
  local_88.error_handler_fn = (exr_error_handler_cb_t)0x0;
  local_88.max_tile_width = 0;
  local_88.max_tile_height = 0;
  local_88._96_8_ = 0;
  local_88.destroy_fn = (exr_destroy_stream_func_ptr_t)0x0;
  local_88.max_image_width = 0;
  local_88.max_image_height = 0;
  local_88.size_fn = (exr_query_size_func_ptr_t)0x0;
  local_88.write_fn = (exr_write_func_ptr_t)0x0;
  local_88.user_data = (void *)0x0;
  local_88.read_fn = (exr_read_func_ptr_t)0x0;
  local_88.alloc_fn = (exr_memory_allocation_func_t)0x0;
  local_88.free_fn = (exr_memory_free_func_t)0x0;
  local_88.size = 0x68;
  local_88.zip_level = -2;
  local_88.dwa_quality = -1.0;
  if (ctxtdata != (exr_context_initializer_t *)0x0) {
    local_88.error_handler_fn = ctxtdata->error_handler_fn;
    local_88.alloc_fn = ctxtdata->alloc_fn;
    local_88.free_fn = ctxtdata->free_fn;
    local_88.user_data = ctxtdata->user_data;
    local_88.read_fn = ctxtdata->read_fn;
    local_88.size_fn = ctxtdata->size_fn;
    local_88.write_fn = ctxtdata->write_fn;
    local_88.destroy_fn = ctxtdata->destroy_fn;
    local_88.max_image_width = ctxtdata->max_image_width;
    local_88.max_image_height = ctxtdata->max_image_height;
    local_88.max_tile_width = ctxtdata->max_tile_width;
    local_88.max_tile_height = ctxtdata->max_tile_height;
    if (0x5f < ctxtdata->size) {
      local_88.zip_level = ctxtdata->zip_level;
      local_88.dwa_quality = ctxtdata->dwa_quality;
    }
    if (0x67 < ctxtdata->size) {
      local_88._100_4_ = 0;
      local_88.flags = ctxtdata->flags;
    }
  }
  internal_exr_update_default_handlers(&local_88);
  if (ctxt == (exr_context_t *)0x0) {
    eVar3 = 3;
    if ((local_88._96_8_ & 2) == 0) {
      (*local_88.error_handler_fn)
                ((exr_const_context_t)0x0,3,"Invalid context handle passed to start_read function");
    }
  }
  else {
    if ((filename == (char *)0x0) || (*filename == '\0')) {
      eVar3 = 3;
      if ((local_88._96_8_ & 2) == 0) {
        (*local_88.error_handler_fn)
                  ((exr_const_context_t)0x0,3,"Invalid filename passed to start_read function");
      }
    }
    else {
      eVar2 = internal_exr_alloc_context(&local_90,&local_88,EXR_CONTEXT_READ,4);
      eVar3 = 1;
      if (eVar2 == 0) {
        local_90->do_read = dispatch_read;
        eVar3 = exr_attr_string_create((exr_context_t)local_90,&local_90->filename,filename);
        if (eVar3 == 0) {
          eVar3 = 0;
          if (local_88.read_fn == (exr_read_func_ptr_t)0x0) {
            local_88.size_fn = default_query_size_func;
            eVar3 = default_init_read_file(local_90);
          }
          p_Var1 = local_90;
          if (eVar3 == 0) {
            if (local_88.size_fn == (exr_query_size_func_ptr_t)0x0) {
              iVar4 = -1;
            }
            else {
              iVar4 = (*local_88.size_fn)((exr_const_context_t)local_90,local_90->user_data);
            }
            p_Var1->file_size = iVar4;
            eVar3 = 0;
          }
          if (eVar3 == 0) {
            eVar3 = internal_exr_parse_header(local_90);
          }
        }
        if (eVar3 == 0) {
          eVar3 = 0;
        }
        else {
          exr_finish((exr_context_t *)&local_90);
        }
      }
    }
    *ctxt = (exr_context_t)local_90;
  }
  return eVar3;
}

Assistant:

exr_result_t
exr_start_read (
    exr_context_t*                   ctxt,
    const char*                      filename,
    const exr_context_initializer_t* ctxtdata)
{
    exr_result_t                  rv    = EXR_ERR_UNKNOWN;
    struct _internal_exr_context* ret   = NULL;
    exr_context_initializer_t     inits = fill_context_data (ctxtdata);

    if (!ctxt)
    {
        if (!(inits.flags & EXR_CONTEXT_FLAG_SILENT_HEADER_PARSE))
            inits.error_handler_fn (
                NULL,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid context handle passed to start_read function");
        return EXR_ERR_INVALID_ARGUMENT;
    }

    if (filename && filename[0] != '\0')
    {
        rv = internal_exr_alloc_context (
            &ret,
            &inits,
            EXR_CONTEXT_READ,
            sizeof (struct _internal_exr_filehandle));
        if (rv == EXR_ERR_SUCCESS)
        {
            ret->do_read = &dispatch_read;

            rv = exr_attr_string_create (
                (exr_context_t) ret, &(ret->filename), filename);
            if (rv == EXR_ERR_SUCCESS)
            {
                if (!inits.read_fn)
                {
                    inits.size_fn = &default_query_size_func;
                    rv            = default_init_read_file (ret);
                }

                if (rv == EXR_ERR_SUCCESS)
                    rv = process_query_size (ret, &inits);
                if (rv == EXR_ERR_SUCCESS) rv = internal_exr_parse_header (ret);
            }

            if (rv != EXR_ERR_SUCCESS) exr_finish ((exr_context_t*) &ret);
        }
        else
            rv = EXR_ERR_OUT_OF_MEMORY;
    }
    else
    {
        if (!(inits.flags & EXR_CONTEXT_FLAG_SILENT_HEADER_PARSE))
            inits.error_handler_fn (
                NULL,
                EXR_ERR_INVALID_ARGUMENT,
                "Invalid filename passed to start_read function");
        rv = EXR_ERR_INVALID_ARGUMENT;
    }

    *ctxt = (exr_context_t) ret;
    return rv;
}